

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_SpawnMapThing(FMapThing *mthing,int position)

{
  double dVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  polyspawns_t *this;
  FPlayerStart *pFVar7;
  APlayerPawn *pAVar8;
  sector_t *psVar9;
  spritedef_t *psVar10;
  char *pcVar11;
  AActor *pAVar12;
  TAngle<double> *other;
  FStrifeDialogueNode **ppFVar13;
  bool local_171;
  int local_144;
  int root;
  int j;
  Self local_138;
  TFlags<ActorFlag2,_unsigned_int> local_134;
  TVector2<double> local_130;
  TVector3<double> local_120;
  TFlags<ActorFlag2,_unsigned_int> local_108;
  TFlags<ActorFlag,_unsigned_int> local_104;
  double local_100;
  double sz;
  TFlags<ActorFlag7,_unsigned_int> local_f0;
  TFlags<ActorFlag,_unsigned_int> local_ec;
  AActor *local_e8;
  AActor *info;
  AActor *defaults;
  uint local_c8;
  uint local_c4;
  int type;
  uint i_2;
  FPlayerStart start_1;
  int local_98;
  int spawnmask_1;
  int i_1;
  int spawnmask;
  polyspawns_t *local_70;
  polyspawns_t *polyspawn;
  FPlayerStart start;
  FDoomEdEntry *pFStack_40;
  int pnum;
  FDoomEdEntry *mentry;
  AActor *mobj;
  PClassActor *pPStack_28;
  int mask;
  PClassActor *i;
  int position_local;
  FMapThing *mthing_local;
  
  if ((mthing->EdNum == 0) || (mthing->EdNum == -1)) {
    return (AActor *)0x0;
  }
  pFStack_40 = mthing->info;
  if (pFStack_40 == (FDoomEdEntry *)0x0) {
    Printf("Unknown type %i at (%.1f, %.1f)\n",(mthing->pos).X,(mthing->pos).Y);
    pFStack_40 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                           (&DoomEdMap,0);
    if (pFStack_40 == (FDoomEdEntry *)0x0) {
      return (AActor *)0x0;
    }
  }
  if ((pFStack_40->Type == (PClassActor *)0x0) && (pFStack_40->Special < 1)) {
    return (AActor *)0x0;
  }
  if ('\0' < pFStack_40->ArgsDefined) {
    if (pFStack_40->Type != (PClassActor *)0x0) {
      mthing->special = (int)pFStack_40->Special;
    }
    memcpy(mthing->args,pFStack_40->Args,(long)pFStack_40->ArgsDefined << 2);
  }
  start._28_4_ = 0xffffffff;
  if (pFStack_40->Type == (PClassActor *)0x0) {
    iVar4 = (int)pFStack_40->Special;
    if (iVar4 - 1U < 8) {
      start._28_4_ = pFStack_40->Special + -1;
    }
    else {
      if (iVar4 == 9) {
        FPlayerStart::FPlayerStart((FPlayerStart *)&polyspawn,mthing,0);
        TArray<FPlayerStart,_FPlayerStart>::Push(&deathmatchstarts,(FPlayerStart *)&polyspawn);
        return (AActor *)0x0;
      }
      if (iVar4 - 0xbU < 4) {
        this = (polyspawns_t *)operator_new(0x20);
        polyspawns_t::polyspawns_t(this);
        this->next = polyspawns;
        local_70 = this;
        TVector2<double>::TVector2((TVector2<double> *)&i_1,&mthing->pos);
        TVector2<double>::operator=(&local_70->pos,(TVector2<double> *)&i_1);
        local_70->angle = mthing->angle;
        local_70->type = pFStack_40->Special;
        if (pFStack_40->Special != 0xb) {
          po_NumPolyobjs = po_NumPolyobjs + 1;
        }
        polyspawns = local_70;
        return (AActor *)0x0;
      }
    }
  }
  if ((start._28_4_ == -1) || ((level.flags & 0x2000000) != 0)) {
    iVar4 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar4 == 0) {
      if ((multiplayer & 1U) == 0) {
        mobj._4_4_ = 0x100;
      }
      else {
        mobj._4_4_ = 0x200;
      }
    }
    else {
      mobj._4_4_ = 0x400;
    }
    if ((mthing->flags & mobj._4_4_) == 0) {
      return (AActor *)0x0;
    }
    uVar5 = G_SkillProperty(SKILLP_SpawnFilter);
    if ((mthing->SkillFilter & uVar5) == 0) {
      return (AActor *)0x0;
    }
    if ((multiplayer & 1U) == 0) {
      uVar5 = player_t::GetSpawnClass((player_t *)(&players + (long)consoleplayer * 0x54));
      if ((uVar5 != 0) && ((mthing->ClassFilter & uVar5) == 0)) {
        return (AActor *)0x0;
      }
    }
    else {
      iVar4 = FIntCVar::operator_cast_to_int(&deathmatch);
      if (iVar4 == 0) {
        mobj._4_4_ = 0;
        for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
          if ((playeringame[local_98] & 1U) != 0) {
            start_1._28_4_ = player_t::GetSpawnClass((player_t *)(&players + (long)local_98 * 0x54))
            ;
            if (start_1._28_4_ == 0) {
              mobj._4_4_ = 0xffffffff;
            }
            else {
              mobj._4_4_ = start_1._28_4_ | mobj._4_4_;
            }
          }
        }
        if ((mobj._4_4_ != 0xffffffff) && ((mthing->ClassFilter & mobj._4_4_) == 0)) {
          return (AActor *)0x0;
        }
      }
    }
  }
  if (start._28_4_ != -1) {
    if (mthing->args[0] != position) {
      return (AActor *)0x0;
    }
    FPlayerStart::FPlayerStart((FPlayerStart *)&type,mthing,start._28_4_ + 1);
    FPlayerStart::operator=(playerstarts + (int)start._28_4_,(FPlayerStart *)&type);
    if ((level.flags2 & 1) == 0) {
      for (local_c4 = 0; uVar5 = local_c4,
          uVar6 = TArray<FPlayerStart,_FPlayerStart>::Size(&AllPlayerStarts), uVar5 < uVar6;
          local_c4 = local_c4 + 1) {
        pFVar7 = TArray<FPlayerStart,_FPlayerStart>::operator[](&AllPlayerStarts,(ulong)local_c4);
        if ((int)pFVar7->type == start._28_4_ + 1) {
          pFVar7 = TArray<FPlayerStart,_FPlayerStart>::operator[](&AllPlayerStarts,(ulong)local_c4);
          FPlayerStart::operator=(pFVar7,(FPlayerStart *)&type);
          break;
        }
      }
      uVar5 = local_c4;
      uVar6 = TArray<FPlayerStart,_FPlayerStart>::Size(&AllPlayerStarts);
      if (uVar5 == uVar6) {
        TArray<FPlayerStart,_FPlayerStart>::Push(&AllPlayerStarts,(FPlayerStart *)&type);
      }
    }
    else {
      TArray<FPlayerStart,_FPlayerStart>::Push(&AllPlayerStarts,(FPlayerStart *)&type);
    }
    iVar4 = FIntCVar::operator_cast_to_int(&deathmatch);
    if ((iVar4 == 0) && ((level.flags2 & 1) == 0)) {
      iVar4 = 0;
      if ((level.flags2 & 0x80) != 0) {
        iVar4 = 2;
      }
      pAVar8 = P_SpawnPlayer((FPlayerStart *)&type,start._28_4_,iVar4);
      return &pAVar8->super_AActor;
    }
    return (AActor *)0x0;
  }
  if ((pFStack_40->Type == (PClassActor *)0x0) && (pFStack_40->Special == 10)) {
    local_c8 = mthing->args[0];
    if (local_c8 == 0xff) {
      local_c8 = 0xffffffff;
    }
    if ((int)local_c8 < 0x40) {
      sVar3 = (short)local_c8;
      TVector2<double>::TVector2((TVector2<double> *)&defaults,&mthing->pos);
      psVar9 = P_PointInSector((DVector2 *)&defaults);
      psVar9->seqType = sVar3;
    }
    else {
      Printf("Sound sequence %d out of range\n",(ulong)local_c8);
    }
    return (AActor *)0x0;
  }
  pPStack_28 = PClassActor::GetReplacement(pFStack_40->Type,true);
  info = GetDefaultByType(&pPStack_28->super_PClass);
  if ((info->SpawnState == (FState *)0x0) ||
     (psVar10 = TArray<spritedef_t,_spritedef_t>::operator[]
                          (&sprites,(ulong)info->SpawnState->sprite), psVar10->numframes == '\0')) {
    if ((gameinfo.flags & 2U) != 0) {
      return (AActor *)0x0;
    }
    pcVar11 = FName::GetChars(&(pPStack_28->super_PClass).super_PStruct.super_PNamedType.TypeName);
    Printf("%s at (%.1f, %.1f) has no frames\n",(mthing->pos).X,(mthing->pos).Y,pcVar11);
    pPStack_28 = PClass::FindActor("Unknown");
    bVar2 = DObject::IsKindOf((DObject *)pPStack_28,PClassActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assert_fail("i->IsKindOf(RUNTIME_CLASS(PClassActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_mobj.cpp"
                    ,0x136c,"AActor *P_SpawnMapThing(FMapThing *, int)");
    }
  }
  local_e8 = GetDefaultByType(&pPStack_28->super_PClass);
  iVar4 = FIntCVar::operator_cast_to_int(&deathmatch);
  bVar2 = false;
  if (iVar4 != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_ec,(int)local_e8 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
    ;
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
    bVar2 = uVar5 != 0;
  }
  if (bVar2) {
    return (AActor *)0x0;
  }
  if ((((multiplayer & 1U) != 0) &&
      (iVar4 = FIntCVar::operator_cast_to_int(&deathmatch), iVar4 == 0)) &&
     (uVar5 = FIntCVar::operator_cast_to_int(&dmflags), (uVar5 & 0x200000) != 0)) {
    pAVar12 = GetDefaultByType(&pPStack_28->super_PClass);
    TFlags<ActorFlag7,_unsigned_int>::operator&
              (&local_f0,
               (int)pAVar12 + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f0);
    if ((uVar5 != 0) && ((mthing->flags & 0x500) == 0x400)) {
      return (AActor *)0x0;
    }
  }
  if ((level.flags2 & 0x8000) == 0) {
    uVar5 = FIntCVar::operator_cast_to_int(&dmflags);
    bVar2 = false;
    if ((uVar5 & 0x1000) == 0) goto LAB_0069c960;
  }
  TFlags<ActorFlag3,_unsigned_int>::operator&
            ((TFlags<ActorFlag3,_unsigned_int> *)((long)&sz + 4),
             (int)local_e8 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
  uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&sz + 4));
  bVar2 = uVar5 != 0;
LAB_0069c960:
  if (bVar2) {
    return (AActor *)0x0;
  }
  iVar4 = FIntCVar::operator_cast_to_int(&deathmatch);
  if ((iVar4 != 0) || (bVar2 = FBoolCVar::operator_cast_to_bool(&alwaysapplydmflags), bVar2)) {
    uVar5 = FIntCVar::operator_cast_to_int(&dmflags);
    if ((uVar5 & 1) != 0) {
      bVar2 = PClass::IsDescendantOf(&pPStack_28->super_PClass,AHealth::RegistrationInfo.MyClass);
      if (bVar2) {
        return (AActor *)0x0;
      }
      bVar2 = FName::operator==(&(pPStack_28->super_PClass).super_PStruct.super_PNamedType.TypeName,
                                NAME_Berserk);
      if (bVar2) {
        return (AActor *)0x0;
      }
      bVar2 = FName::operator==(&(pPStack_28->super_PClass).super_PStruct.super_PNamedType.TypeName,
                                NAME_Megasphere);
      if (bVar2) {
        return (AActor *)0x0;
      }
    }
    FIntCVar::operator_cast_to_int(&dmflags);
    uVar5 = FIntCVar::operator_cast_to_int(&dmflags);
    if ((uVar5 & 0x200) != 0) {
      bVar2 = PClass::IsDescendantOf(&pPStack_28->super_PClass,AArmor::RegistrationInfo.MyClass);
      if (bVar2) {
        return (AActor *)0x0;
      }
      bVar2 = FName::operator==(&(pPStack_28->super_PClass).super_PStruct.super_PNamedType.TypeName,
                                NAME_Megasphere);
      if (bVar2) {
        return (AActor *)0x0;
      }
    }
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_104,(int)local_e8 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
  if (uVar5 == 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_108,(int)local_e8 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_108);
    if (uVar5 == 0) {
      local_100 = -2147483648.0;
    }
    else {
      local_100 = 2147483646.0;
    }
  }
  else {
    local_100 = 2147483647.0;
  }
  TVector2<double>::TVector2(&local_130,&mthing->pos);
  TVector3<double>::TVector3(&local_120,&local_130,local_100);
  pAVar12 = AActor::StaticSpawn(pPStack_28,&local_120,NO_REPLACE,true);
  iVar4 = (int)pAVar12;
  if ((local_100 != -2147483648.0) || (NAN(local_100))) {
    if ((local_100 == 2147483647.0) && (!NAN(local_100))) {
      AActor::AddZ(pAVar12,-(mthing->pos).Z,true);
    }
  }
  else {
    AActor::AddZ(pAVar12,(mthing->pos).Z,true);
    TFlags<ActorFlag2,_unsigned_int>::operator&(&local_134,iVar4 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY))
    ;
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_134);
    local_171 = uVar5 != 0 && (ib_compatflags & 0x100U) != 0;
    if (local_171) {
      pAVar12->specialf1 = (mthing->pos).Z;
    }
  }
  TVector3<double>::operator=(&pAVar12->SpawnPoint,&mthing->pos);
  pAVar12->SpawnAngle = mthing->angle;
  pAVar12->SpawnFlags = mthing->flags;
  if ((-1 < mthing->FloatbobPhase) && (mthing->FloatbobPhase < 0x40)) {
    pAVar12->FloatBobPhase = (BYTE)mthing->FloatbobPhase;
  }
  if (0.0 < mthing->Gravity || mthing->Gravity == 0.0) {
    if (mthing->Gravity <= 0.0) {
      operator~((EnumType)&local_138);
      TFlags<ActorFlag,_unsigned_int>::operator&=(&pAVar12->flags,&local_138);
    }
    else {
      pAVar12->Gravity = mthing->Gravity * pAVar12->Gravity;
    }
  }
  else {
    pAVar12->Gravity = -mthing->Gravity;
  }
  bVar2 = true;
  if ((pAVar12->specialf1 != 0.0) || (NAN(pAVar12->specialf1))) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)&j,iVar4 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&j);
    bVar2 = true;
    if (uVar5 != 0) {
      bVar2 = (ib_compatflags & 0x100U) == 0;
    }
  }
  if (bVar2) {
    P_FindFloorCeiling(pAVar12,0xe);
  }
  TFlags<ActorFlag2,_unsigned_int>::operator&
            ((TFlags<ActorFlag2,_unsigned_int> *)&root,iVar4 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
  uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&root);
  if (uVar5 == 0) {
    pAVar12->special = mthing->special;
    for (local_144 = 0; local_144 < 5; local_144 = local_144 + 1) {
      pAVar12->args[local_144] = mthing->args[local_144];
    }
  }
  pAVar12->tid = mthing->thingid;
  AActor::AddToHash(pAVar12);
  other = TAngle<double>::operator=(&(pAVar12->Angles).Yaw,(double)(int)mthing->angle);
  TAngle<double>::operator=(&(pAVar12->PrevAngles).Yaw,other);
  if ((0 < mthing->Conversation) && (iVar4 = GetConversation(mthing->Conversation), iVar4 != -1)) {
    pAVar12->ConversationRoot = iVar4;
    ppFVar13 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                         (&StrifeDialogues,(long)pAVar12->ConversationRoot);
    pAVar12->Conversation = *ppFVar13;
  }
  if (0.0 <= mthing->Alpha) {
    pAVar12->Alpha = mthing->Alpha;
  }
  if (mthing->RenderStyle != 0xe) {
    FRenderStyle::operator=((FRenderStyle *)&(pAVar12->RenderStyle).field_0,mthing->RenderStyle);
  }
  dVar1 = (mthing->Scale).X;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (pAVar12->Scale).X = (mthing->Scale).X * (pAVar12->Scale).X;
  }
  dVar1 = (mthing->Scale).Y;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (pAVar12->Scale).Y = (mthing->Scale).Y * (pAVar12->Scale).Y;
  }
  if (mthing->pitch != 0) {
    TAngle<double>::operator=(&(pAVar12->Angles).Pitch,(double)(int)mthing->pitch);
  }
  if (mthing->roll != 0) {
    TAngle<double>::operator=(&(pAVar12->Angles).Roll,(double)(int)mthing->roll);
  }
  if (mthing->score != 0) {
    pAVar12->Score = mthing->score;
  }
  if (mthing->fillcolor != 0) {
    pAVar12->fillcolor = mthing->fillcolor;
  }
  (*(pAVar12->super_DThinker).super_DObject._vptr_DObject[9])();
  if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
    (*(pAVar12->super_DThinker).super_DObject._vptr_DObject[10])();
  }
  if (mthing->health < 1) {
    pAVar12->health = -mthing->health;
  }
  else {
    pAVar12->health = mthing->health * pAVar12->health;
  }
  if (mthing->health == 0) {
    (*(pAVar12->super_DThinker).super_DObject._vptr_DObject[0xf])(pAVar12,0,0,0);
  }
  else if (mthing->health != 1) {
    pAVar12->StartHealth = pAVar12->health;
  }
  return pAVar12;
}

Assistant:

AActor *P_SpawnMapThing (FMapThing *mthing, int position)
{
	PClassActor *i;
	int mask;
	AActor *mobj;

	if (mthing->EdNum == 0 || mthing->EdNum == -1)
		return NULL;

	// find which type to spawn
	FDoomEdEntry *mentry = mthing->info;

	if (mentry == NULL)
	{
		// [RH] Don't die if the map tries to spawn an unknown thing
		Printf("Unknown type %i at (%.1f, %.1f)\n",
			mthing->EdNum, mthing->pos.X, mthing->pos.Y);
		mentry = DoomEdMap.CheckKey(0);
		if (mentry == NULL)	// we need a valid entry for the rest of this function so if we can't find a default, let's exit right away.
		{
		return NULL;
	}
	}
	if (mentry->Type == NULL && mentry->Special <= 0)
	{
		// has been explicitly set to not spawning anything.
		return NULL;
	}

	// copy args to mapthing so that we have them in one place for the rest of this function	
	if (mentry->ArgsDefined > 0)
	{
		if (mentry->Type!= NULL) mthing->special = mentry->Special;
		memcpy(mthing->args, mentry->Args, sizeof(mthing->args[0]) * mentry->ArgsDefined);
	}

	int pnum = -1;
	if (mentry->Type == NULL)
	{

		switch (mentry->Special)
		{
		case SMT_DeathmatchStart:
		{
			// count deathmatch start positions
			FPlayerStart start(mthing, 0);
			deathmatchstarts.Push(start);
			return NULL;
		}

		case SMT_PolyAnchor:
		case SMT_PolySpawn:
		case SMT_PolySpawnCrush:
		case SMT_PolySpawnHurt:
	{
		polyspawns_t *polyspawn = new polyspawns_t;
		polyspawn->next = polyspawns;
		polyspawn->pos = mthing->pos;
		polyspawn->angle = mthing->angle;
		polyspawn->type = mentry->Special;
		polyspawns = polyspawn;
			if (mentry->Special != SMT_PolyAnchor)
			po_NumPolyobjs++;
		return NULL;
	}

		case SMT_Player1Start:
		case SMT_Player2Start:
		case SMT_Player3Start:
		case SMT_Player4Start:
		case SMT_Player5Start:
		case SMT_Player6Start:
		case SMT_Player7Start:
		case SMT_Player8Start:
			pnum = mentry->Special - SMT_Player1Start;
			break;

		// Sound sequence override will be handled later
		default:
			break;

	}
		}

	if (pnum == -1 || (level.flags & LEVEL_FILTERSTARTS))
	{
		// check for appropriate game type
		if (deathmatch) 
		{
			mask = MTF_DEATHMATCH;
		}
		else if (multiplayer)
		{
			mask = MTF_COOPERATIVE;
		}
		else
		{
			mask = MTF_SINGLE;
		}
		if (!(mthing->flags & mask))
		{
			return NULL;
		}

		mask = G_SkillProperty(SKILLP_SpawnFilter);
		if (!(mthing->SkillFilter & mask))
		{
			return NULL;
		}

		// Check class spawn masks. Now with player classes available
		// this is enabled for all games.
		if (!multiplayer)
		{ // Single player
			int spawnmask = players[consoleplayer].GetSpawnClass();
			if (spawnmask != 0 && (mthing->ClassFilter & spawnmask) == 0)
			{ // Not for current class
				return NULL;
			}
		}
		else if (!deathmatch)
		{ // Cooperative
			mask = 0;
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (playeringame[i])
				{
					int spawnmask = players[i].GetSpawnClass();
					if (spawnmask != 0)
						mask |= spawnmask;
					else 
						mask = -1;
				}
			}
			if (mask != -1 && (mthing->ClassFilter & mask) == 0)
			{
				return NULL;
			}
		}
	}

	if (pnum != -1)
	{
		// [RH] Only spawn spots that match position.
		if (mthing->args[0] != position)
			return NULL;

		// save spots for respawning in network games
		FPlayerStart start(mthing, pnum+1);
		playerstarts[pnum] = start;
		if (level.flags2 & LEVEL2_RANDOMPLAYERSTARTS)
		{ // When using random player starts, all starts count
			AllPlayerStarts.Push(start);
		}
		else
		{ // When not using random player starts, later single player
		  // starts should override earlier ones, since the earlier
		  // ones are for voodoo dolls and not likely to be ideal for
		  // spawning regular players.
			unsigned i;
			for (i = 0; i < AllPlayerStarts.Size(); ++i)
			{
				if (AllPlayerStarts[i].type == pnum+1)
				{
					AllPlayerStarts[i] = start;
					break;
				}
			}
			if (i == AllPlayerStarts.Size())
			{
				AllPlayerStarts.Push(start);
			}
		}
		if (!deathmatch && !(level.flags2 & LEVEL2_RANDOMPLAYERSTARTS))
		{
			return P_SpawnPlayer(&start, pnum, (level.flags2 & LEVEL2_PRERAISEWEAPON) ? SPF_WEAPONFULLYUP : 0);
		}
		return NULL;
	}

	// [RH] sound sequence overriders
	if (mentry->Type == NULL && mentry->Special == SMT_SSeqOverride)
	{
		int type = mthing->args[0];
		if (type == 255) type = -1;
		if (type > 63)
		{
			Printf ("Sound sequence %d out of range\n", type);
		}
		else
		{
			P_PointInSector (mthing->pos)->seqType = type;
		}
		return NULL;
	}

	// [RH] If the thing's corresponding sprite has no frames, also map
	//		it to the unknown thing.
		// Handle decorate replacements explicitly here
		// to check for missing frames in the replacement object.
	i = mentry->Type->GetReplacement();

		const AActor *defaults = GetDefaultByType (i);
		if (defaults->SpawnState == NULL ||
			sprites[defaults->SpawnState->sprite].numframes == 0)
		{
			// We don't load mods for shareware games so we'll just ignore
			// missing actors. Heretic needs this since the shareware includes
			// the retail weapons in Deathmatch.
			if (gameinfo.flags & GI_SHAREWARE)
				return NULL;

			Printf ("%s at (%.1f, %.1f) has no frames\n",
					i->TypeName.GetChars(), mthing->pos.X, mthing->pos.Y);
			i = PClass::FindActor("Unknown");
			assert(i->IsKindOf(RUNTIME_CLASS(PClassActor)));
		}

	const AActor *info = GetDefaultByType (i);

	// don't spawn keycards and players in deathmatch
	if (deathmatch && info->flags & MF_NOTDMATCH)
		return NULL;

	// [RH] don't spawn extra weapons in coop if so desired
	if (multiplayer && !deathmatch && (dmflags & DF_NO_COOP_WEAPON_SPAWN))
	{
		if (GetDefaultByType(i)->flags7 & MF7_WEAPONSPAWN)
		{
			if ((mthing->flags & (MTF_DEATHMATCH|MTF_SINGLE)) == MTF_DEATHMATCH)
				return NULL;
		}
	}

	// don't spawn any monsters if -nomonsters
	if (((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS)) && info->flags3 & MF3_ISMONSTER )
	{
		return NULL;
	}
	
	// [RH] Other things that shouldn't be spawned depending on dmflags
	if (deathmatch || alwaysapplydmflags)
	{
		if (dmflags & DF_NO_HEALTH)
		{
			if (i->IsDescendantOf (RUNTIME_CLASS(AHealth)))
				return NULL;
			if (i->TypeName == NAME_Berserk)
				return NULL;
			if (i->TypeName == NAME_Megasphere)
				return NULL;
		}
		if (dmflags & DF_NO_ITEMS)
		{
//			if (i->IsDescendantOf (RUNTIME_CLASS(AArtifact)))
//				return;
		}
		if (dmflags & DF_NO_ARMOR)
		{
			if (i->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				return NULL;
			if (i->TypeName == NAME_Megasphere)
				return NULL;
		}
	}

	// spawn it
	double sz;

	if (info->flags & MF_SPAWNCEILING)
		sz = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		sz = FLOATRANDZ;
	else
		sz = ONFLOORZ;

	mobj = AActor::StaticSpawn (i, DVector3(mthing->pos, sz), NO_REPLACE, true);

	if (sz == ONFLOORZ)
	{
		mobj->AddZ(mthing->pos.Z);
		if ((mobj->flags2 & MF2_FLOATBOB) && (ib_compatflags & BCOMPATF_FLOATBOB))
		{
			mobj->specialf1 = mthing->pos.Z;
		}
	}
	else if (sz == ONCEILINGZ)
		mobj->AddZ(-mthing->pos.Z);

	mobj->SpawnPoint = mthing->pos;
	mobj->SpawnAngle = mthing->angle;
	mobj->SpawnFlags = mthing->flags;
	if (mthing->FloatbobPhase >= 0 && mthing->FloatbobPhase < 64) mobj->FloatBobPhase = mthing->FloatbobPhase;
	if (mthing->Gravity < 0) mobj->Gravity = -mthing->Gravity;
	else if (mthing->Gravity > 0) mobj->Gravity *= mthing->Gravity;
	else mobj->flags &= ~MF_NOGRAVITY;

	// For Hexen floatbob 'compatibility' we do not really want to alter the floorz.
	if (mobj->specialf1 == 0 || !(mobj->flags2 & MF2_FLOATBOB) || !(ib_compatflags & BCOMPATF_FLOATBOB))
	{
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	// if the actor got args defined either in DECORATE or MAPINFO we must ignore the map's properties.
	if (!(mobj->flags2 & MF2_ARGSDEFINED))
	{
		// [RH] Set the thing's special
		mobj->special = mthing->special;
		for(int j=0;j<5;j++) mobj->args[j]=mthing->args[j];
	}

	// [RH] Add ThingID to mobj and link it in with the others
	mobj->tid = mthing->thingid;
	mobj->AddToHash ();

	mobj->PrevAngles.Yaw = mobj->Angles.Yaw = (double)mthing->angle;

	// Check if this actor's mapthing has a conversation defined
	if (mthing->Conversation > 0)
	{
		// Make sure that this does not partially overwrite the default dialogue settings.
		int root = GetConversation(mthing->Conversation);
		if (root != -1)
		{
			mobj->ConversationRoot = root;
			mobj->Conversation = StrifeDialogues[mobj->ConversationRoot];
		}
	}

	// Set various UDMF options
	if (mthing->Alpha >= 0)
		mobj->Alpha = mthing->Alpha;
	if (mthing->RenderStyle != STYLE_Count)
		mobj->RenderStyle = (ERenderStyle)mthing->RenderStyle;
	if (mthing->Scale.X != 0)
		mobj->Scale.X = mthing->Scale.X * mobj->Scale.X;
	if (mthing->Scale.Y != 0)
		mobj->Scale.Y = mthing->Scale.Y * mobj->Scale.Y;
	if (mthing->pitch)
		mobj->Angles.Pitch = (double)mthing->pitch;
	if (mthing->roll)
		mobj->Angles.Roll = (double)mthing->roll;
	if (mthing->score)
		mobj->Score = mthing->score;
	if (mthing->fillcolor)
		mobj->fillcolor = mthing->fillcolor;

	mobj->BeginPlay ();
	if (!(mobj->ObjectFlags & OF_EuthanizeMe))
	{
		mobj->LevelSpawned ();
	}

	if (mthing->health > 0)
		mobj->health *= mthing->health;
	else
		mobj->health = -mthing->health;
	if (mthing->health == 0)
		mobj->Die(NULL, NULL);
	else if (mthing->health != 1)
		mobj->StartHealth = mobj->health;

	return mobj;
}